

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O0

void re2c::genCondGotoSub
               (OutputFile *o,uint32_t ind,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *condnames,uint32_t cMin,uint32_t cMax)

{
  OutputFile *pOVar1;
  opt_t *poVar2;
  const_reference s;
  string local_50;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t cMid;
  uint32_t cMax_local;
  uint32_t cMin_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *condnames_local;
  OutputFile *pOStack_10;
  uint32_t ind_local;
  OutputFile *o_local;
  
  local_28 = cMax;
  cMid = cMin;
  _cMax_local = condnames;
  condnames_local._4_4_ = ind;
  pOStack_10 = o;
  if (cMin == cMax) {
    pOVar1 = OutputFile::wind(o,ind);
    pOVar1 = OutputFile::ws(pOVar1,"goto ");
    poVar2 = Opt::operator->((Opt *)&opts);
    pOVar1 = OutputFile::wstring(pOVar1,&poVar2->condPrefix);
    s = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](_cMax_local,(ulong)cMid);
    pOVar1 = OutputFile::wstring(pOVar1,s);
    OutputFile::ws(pOVar1,";\n");
  }
  else {
    local_2c = cMin + ((cMax - cMin) + 1 >> 1);
    pOVar1 = OutputFile::wind(o,ind);
    pOVar1 = OutputFile::ws(pOVar1,"if (");
    genGetCondition_abi_cxx11_();
    pOVar1 = OutputFile::wstring(pOVar1,&local_50);
    pOVar1 = OutputFile::ws(pOVar1," < ");
    pOVar1 = OutputFile::wu32(pOVar1,local_2c);
    OutputFile::ws(pOVar1,") {\n");
    std::__cxx11::string::~string((string *)&local_50);
    genCondGotoSub(pOStack_10,condnames_local._4_4_ + 1,_cMax_local,cMid,local_2c - 1);
    pOVar1 = OutputFile::wind(pOStack_10,condnames_local._4_4_);
    OutputFile::ws(pOVar1,"} else {\n");
    genCondGotoSub(pOStack_10,condnames_local._4_4_ + 1,_cMax_local,local_2c,local_28);
    pOVar1 = OutputFile::wind(pOStack_10,condnames_local._4_4_);
    OutputFile::ws(pOVar1,"}\n");
  }
  return;
}

Assistant:

void genCondGotoSub(OutputFile & o, uint32_t ind, const std::vector<std::string> & condnames, uint32_t cMin, uint32_t cMax)
{
	if (cMin == cMax)
	{
		o.wind(ind).ws("goto ").wstring(opts->condPrefix).wstring(condnames[cMin]).ws(";\n");
	}
	else
	{
		uint32_t cMid = cMin + ((cMax - cMin + 1) / 2);

		o.wind(ind).ws("if (").wstring(genGetCondition()).ws(" < ").wu32(cMid).ws(") {\n");
		genCondGotoSub(o, ind + 1, condnames, cMin, cMid - 1);
		o.wind(ind).ws("} else {\n");
		genCondGotoSub(o, ind + 1, condnames, cMid, cMax);
		o.wind(ind).ws("}\n");
	}
}